

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderDoExpand(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((reader->node != (xmlNodePtr)0x0) && (reader->ctxt != (xmlParserCtxtPtr)0x0)) {
    iVar3 = 1;
    do {
      if (1 < reader->ctxt->disableSAX) {
        return 1;
      }
      for (pxVar2 = reader->node; pxVar2 != (xmlNodePtr)0x0; pxVar2 = pxVar2->parent) {
        if (pxVar2->next != (_xmlNode *)0x0) {
          return 1;
        }
      }
      if (reader->ctxt->nodeNr < reader->depth) {
        return 1;
      }
      if (reader->mode == 3) {
        return 1;
      }
      iVar1 = xmlTextReaderPushData(reader);
      if (iVar1 < 0) {
        reader->mode = 2;
        reader->state = XML_TEXTREADER_ERROR;
        return -1;
      }
    } while (reader->mode != 3);
  }
  return iVar3;
}

Assistant:

static int
xmlTextReaderDoExpand(xmlTextReaderPtr reader) {
    int val;

    if ((reader == NULL) || (reader->node == NULL) || (reader->ctxt == NULL))
        return(-1);
    do {
	if (PARSER_STOPPED(reader->ctxt))
            return(1);

        if (xmlTextReaderGetSuccessor(reader->node) != NULL)
	    return(1);
	if (reader->ctxt->nodeNr < reader->depth)
	    return(1);
	if (reader->mode == XML_TEXTREADER_MODE_EOF)
	    return(1);
	val = xmlTextReaderPushData(reader);
	if (val < 0){
	    reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
	}
    } while(reader->mode != XML_TEXTREADER_MODE_EOF);
    return(1);
}